

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O3

int __thiscall Jzon::Node::toInt(Node *this,int def)

{
  Data *pDVar1;
  stringstream local_1a0 [8];
  stringstream sstr;
  ios_base local_120 [268];
  int local_14 [2];
  int val;
  
  pDVar1 = this->data;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->type == T_NUMBER)) {
    std::__cxx11::stringstream::stringstream(local_1a0,(string *)&pDVar1->valueStr,_S_out|_S_in);
    std::istream::operator>>((istream *)local_1a0,local_14);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    def = local_14[0];
  }
  return def;
}

Assistant:

int Node::toInt(int def) const { GET_NUMBER(int) }